

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O1

ostream * tactile::operator<<(ostream *os,Range *r)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  poVar1 = std::ostream::_M_insert<double>((double)r->fMin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>((double)r->fMax);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Range &r)
{
	return os << "[" << r.min() << "," << r.max() << "]";
}